

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_MinimumFee_Test::
~CoinSelection_SelectCoins_Simple_KnapsackSolver_MinimumFee_Test
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_MinimumFee_Test *this)

{
  void *in_RDI;
  
  ~CoinSelection_SelectCoins_Simple_KnapsackSolver_MinimumFee_Test
            ((CoinSelection_SelectCoins_Simple_KnapsackSolver_MinimumFee_Test *)0x23c5e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_MinimumFee)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(468700000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1000);
  bool use_bnb = false;
  CoinSelectionOption option = GetBitcoinOption();
  option.SetKnapsackMinimumChange(0);  // minimum change is BnB level
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, option,
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 2);
  EXPECT_EQ(select_value.GetSatoshiValue(), 468750000);
  EXPECT_EQ(fee.GetSatoshiValue(), 3600);
  if (ret.size() == 2) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(312500000));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(156250000));
  }
  EXPECT_FALSE(use_bnb);
}